

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidget::setSelectedDate(QCalendarWidget *this,QDate date)

{
  QCalendarWidgetPrivate *this_00;
  undefined8 uVar1;
  int year;
  int month;
  QDate QVar2;
  QCalendarModel *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  qint64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
  pQVar3 = this_00->m_model;
  if ((pQVar3->m_date).jd == date.jd) {
    QVar2 = QCalendarWidgetPrivate::getCurrentDate(this_00);
    if ((0x16d3e147973 < date.jd + 0xb69eeff91fU) || (QVar2.jd == date.jd)) goto LAB_003a7dea;
    pQVar3 = this_00->m_model;
  }
  else if (0x16d3e147973 < date.jd + 0xb69eeff91fU) goto LAB_003a7dea;
  (pQVar3->m_date).jd = date.jd;
  lVar4 = (pQVar3->m_minimumDate).jd;
  if ((date.jd < lVar4) || (lVar4 = (pQVar3->m_maximumDate).jd, lVar4 < date.jd)) {
    (pQVar3->m_date).jd = lVar4;
  }
  QCalendarWidgetPrivate::update(this_00);
  local_40 = (this_00->m_model->m_date).jd;
  uVar1 = *(undefined8 *)&this_00->m_model->m_calendar;
  year = QDate::year(&local_40,uVar1);
  month = QDate::month(&local_40,uVar1);
  QCalendarWidgetPrivate::showMonth(this_00,year,month);
  selectionChanged(this);
LAB_003a7dea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidget::setSelectedDate(QDate date)
{
    Q_D(QCalendarWidget);
    if (d->m_model->m_date == date && date == d->getCurrentDate())
        return;

    if (!date.isValid())
        return;

    d->m_model->setDate(date);
    d->update();
    QDate newDate = d->m_model->m_date;
    QCalendar cal = d->m_model->m_calendar;
    d->showMonth(newDate.year(cal), newDate.month(cal));
    emit selectionChanged();
}